

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

Curl_addrinfo * ainext(connectdata *conn,int tempindex,_Bool next)

{
  Curl_addrinfo *pCVar1;
  
  pCVar1 = conn->tempaddr[tempindex];
  if (pCVar1 == (Curl_addrinfo *)0x0 || !next) goto LAB_004ac900;
  do {
    pCVar1 = pCVar1->ai_next;
LAB_004ac900:
  } while ((pCVar1 != (Curl_addrinfo *)0x0) && (pCVar1->ai_family != conn->tempfamily[tempindex]));
  conn->tempaddr[tempindex] = pCVar1;
  return pCVar1;
}

Assistant:

static struct Curl_addrinfo *ainext(struct connectdata *conn,
                                    int tempindex,
                                    bool next) /* use next entry? */
{
  struct Curl_addrinfo *ai = conn->tempaddr[tempindex];
  if(ai && next)
    ai = ai->ai_next;
  while(ai && (ai->ai_family != conn->tempfamily[tempindex]))
    ai = ai->ai_next;
  conn->tempaddr[tempindex] = ai;
  return ai;
}